

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O1

int CheckOpponent(Situation *situation)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ushort uVar5;
  byte bVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  bool bVar17;
  
  iVar4 = situation->current_player;
  iVar8 = iVar4 * 0x10;
  uVar1 = iVar8 + 0x10;
  bVar2 = situation->current_pieces[iVar4 * -0x10 + 0x20];
  uVar11 = (ulong)bVar2;
  uVar13 = iVar8 + 0x16;
  lVar15 = (long)(int)uVar1;
  lVar12 = (long)(int)uVar13;
  uVar10 = iVar8 + 0x15;
  bVar17 = false;
  lVar9 = lVar15;
  do {
    bVar3 = situation->current_pieces[lVar9 + 5];
    if (bVar3 != 0) {
      if ((HORSE_LEGAL_MOVE[(bVar2 + 0x100) - (uint)bVar3] == 0) ||
         (situation->current_board
          [(int)(HORSE_LEGAL_MOVE[(bVar2 + 0x100) - (uint)bVar3] + (uint)bVar3)] != '\0')) {
        bVar7 = true;
      }
      else {
        bVar7 = false;
        uVar13 = uVar10;
      }
      if (!bVar7) break;
    }
    lVar14 = lVar9 + 5;
    uVar10 = uVar10 + 1;
    bVar17 = lVar12 <= lVar14;
    lVar9 = lVar9 + 1;
  } while (lVar14 < lVar12);
  if (bVar17) {
    uVar10 = iVar8 + 0x17;
    bVar17 = false;
    lVar9 = lVar15;
    do {
      bVar3 = situation->current_pieces[lVar9 + 7];
      if (bVar3 != 0) {
        bVar6 = bVar3 >> 4;
        uVar16 = bVar3 & 0xf;
        if (uVar16 == (bVar2 & 0xf)) {
          uVar5 = *(ushort *)
                   ((ulong)bVar6 * 0x2000 + 0x328d52 + (ulong)situation->bit_col[uVar16] * 8) &
                  BIT_COL_MASK[uVar11];
        }
        else {
          if (bVar6 != bVar2 >> 4) goto LAB_00108c4e;
          uVar5 = *(ushort *)
                   ((ulong)(uVar16 << 0xc) + 0x322d52 + (ulong)situation->bit_row[bVar6] * 8) &
                  BIT_ROW_MASK[uVar11];
        }
        uVar16 = uVar10;
        if (uVar5 != 0) break;
      }
LAB_00108c4e:
      uVar10 = uVar10 + 1;
      lVar12 = lVar9 + 7;
      bVar17 = iVar8 + 0x18 <= lVar12;
      lVar9 = lVar9 + 1;
      uVar16 = uVar13;
    } while (lVar12 < iVar8 + 0x18);
    uVar13 = uVar16;
    if (bVar17) {
      uVar10 = iVar8 + 0x19;
      bVar17 = false;
      do {
        bVar3 = situation->current_pieces[lVar15 + 9];
        if (bVar3 != 0) {
          bVar6 = bVar3 >> 4;
          uVar13 = bVar3 & 0xf;
          if (uVar13 == (bVar2 & 0xf)) {
            uVar5 = *(ushort *)
                     ((ulong)bVar6 * 0x2000 + 0x328d54 + (ulong)situation->bit_col[uVar13] * 8) &
                    BIT_COL_MASK[uVar11];
          }
          else {
            if (bVar6 != bVar2 >> 4) goto LAB_00108cf0;
            uVar5 = *(ushort *)
                     ((ulong)(uVar13 << 0xc) + 0x322d54 + (ulong)situation->bit_row[bVar6] * 8) &
                    BIT_ROW_MASK[uVar11];
          }
          uVar13 = uVar10;
          if (uVar5 != 0) break;
        }
LAB_00108cf0:
        uVar10 = uVar10 + 1;
        lVar9 = lVar15 + 9;
        bVar17 = iVar8 + 0x1a <= lVar9;
        lVar15 = lVar15 + 1;
        uVar13 = uVar16;
      } while (lVar9 < iVar8 + 0x1a);
      if ((bVar17) &&
         (bVar3 = situation->current_board[(int)((uint)bVar2 + iVar4 * -0x20 + 0x10)],
         uVar13 = (uint)bVar3, (uVar1 & bVar3) == 0 || (bVar3 & 0xf) < 0xb)) {
        lVar9 = uVar11 - 3;
        do {
          bVar3 = situation->current_board[lVar9 + 2];
          if (10 < (bVar3 & 0xf) && (uVar1 & bVar3) != 0) {
            return (uint)bVar3;
          }
          lVar9 = lVar9 + 2;
        } while (lVar9 < (long)(ulong)bVar2);
        uVar13 = 0;
      }
    }
  }
  return uVar13;
}

Assistant:

int CheckOpponent(const Situation & situation){
    // 1. 获得玩家特征值
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int from, to, from_row, from_col, to_row, to_col;

    // 1. 判断对方将(帅)是否在棋盘上，并记录其位置
    to = situation.current_pieces[GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0];
    // if(to == 0) return 1;
    to_row = GetRow(to);
    to_col = GetCol(to);

    // 2. 检测马的将军
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
            if(horse_leg != from && situation.current_board[horse_leg] == 0) return i;
        }
    }

    // 3. 检测车的将军
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }
    
    // 4. 检测炮的将军
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }

    // 5. 检测兵(卒)的将军(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
        return from_id;

    // 6. 检测兵(卒)的将军(横向)
    for(from = to - 1; from <= to + 1; from += 2){
        int from_id = situation.current_board[from];
        if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
            return from_id;
    }

    // 7. 没有被将军
    return 0;
}